

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_pmaps.cc
# Opt level: O3

void * v2i_POLICY_MAPPINGS(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  OPENSSL_STACK *sk;
  size_t sVar1;
  undefined8 *puVar2;
  ASN1_VALUE *val;
  size_t sVar3;
  ASN1_OBJECT *pAVar4;
  int line;
  
  sk = OPENSSL_sk_new_null();
  if (sk == (OPENSSL_STACK *)0x0) {
LAB_0023c0ae:
    sk = (OPENSSL_STACK *)0x0;
  }
  else {
    sVar1 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    if (sVar1 != 0) {
      sVar1 = 0;
      do {
        puVar2 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)nval,sVar1);
        if ((puVar2[2] == 0) || (puVar2[1] == 0)) {
          line = 0x55;
LAB_0023c063:
          ERR_put_error(0x14,0,0x81,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_pmaps.cc"
                        ,line);
          ERR_add_error_data(6,"section:",*puVar2,",name:",puVar2[1],",value:",puVar2[2]);
LAB_0023c098:
          OPENSSL_sk_pop_free_ex(sk,sk_POLICY_MAPPING_call_free_func,POLICY_MAPPING_free);
          goto LAB_0023c0ae;
        }
        val = ASN1_item_new((ASN1_ITEM *)&POLICY_MAPPING_it);
        if (val == (ASN1_VALUE *)0x0) {
          val = (ASN1_VALUE *)0x0;
LAB_0023c043:
          ASN1_item_free(val,(ASN1_ITEM *)&POLICY_MAPPING_it);
          goto LAB_0023c098;
        }
        sVar3 = OPENSSL_sk_push(sk,val);
        if (sVar3 == 0) goto LAB_0023c043;
        pAVar4 = OBJ_txt2obj((char *)puVar2[1],0);
        *(ASN1_OBJECT **)val = pAVar4;
        pAVar4 = OBJ_txt2obj((char *)puVar2[2],0);
        *(ASN1_OBJECT **)(val + 8) = pAVar4;
        if ((*(long *)val == 0) || (pAVar4 == (ASN1_OBJECT *)0x0)) {
          line = 99;
          goto LAB_0023c063;
        }
        sVar1 = sVar1 + 1;
        sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
      } while (sVar1 < sVar3);
    }
  }
  return sk;
}

Assistant:

static void *v2i_POLICY_MAPPINGS(const X509V3_EXT_METHOD *method,
                                 const X509V3_CTX *ctx,
                                 const STACK_OF(CONF_VALUE) *nval) {
  POLICY_MAPPINGS *pmaps = sk_POLICY_MAPPING_new_null();
  if (pmaps == NULL) {
    return NULL;
  }

  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(nval, i);
    if (!val->value || !val->name) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OBJECT_IDENTIFIER);
      X509V3_conf_err(val);
      goto err;
    }

    POLICY_MAPPING *pmap = POLICY_MAPPING_new();
    if (pmap == NULL || !sk_POLICY_MAPPING_push(pmaps, pmap)) {
      POLICY_MAPPING_free(pmap);
      goto err;
    }

    pmap->issuerDomainPolicy = OBJ_txt2obj(val->name, 0);
    pmap->subjectDomainPolicy = OBJ_txt2obj(val->value, 0);
    if (!pmap->issuerDomainPolicy || !pmap->subjectDomainPolicy) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OBJECT_IDENTIFIER);
      X509V3_conf_err(val);
      goto err;
    }
  }
  return pmaps;

err:
  sk_POLICY_MAPPING_pop_free(pmaps, POLICY_MAPPING_free);
  return NULL;
}